

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O3

void ImPlot::PushStyleColor(ImPlotCol idx,ImVec4 *col)

{
  ImVec4 *pIVar1;
  ImGuiColorMod *__src;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  ImPlotContext *pIVar6;
  int iVar7;
  ImGuiColorMod *__dest;
  int iVar8;
  ImVec4 *pIVar9;
  int iVar10;
  
  pIVar6 = GImPlot;
  pIVar9 = (GImPlot->Style).Colors + idx;
  fVar2 = pIVar9->x;
  fVar3 = pIVar9->y;
  pIVar1 = (GImPlot->Style).Colors + idx;
  fVar4 = pIVar1->z;
  fVar5 = pIVar1->w;
  iVar7 = (GImPlot->ColorModifiers).Size;
  if (iVar7 == (GImPlot->ColorModifiers).Capacity) {
    if (iVar7 == 0) {
      iVar8 = 8;
    }
    else {
      iVar8 = iVar7 / 2 + iVar7;
    }
    iVar10 = iVar7 + 1;
    if (iVar7 + 1 < iVar8) {
      iVar10 = iVar8;
    }
    __dest = (ImGuiColorMod *)ImGui::MemAlloc((long)iVar10 * 0x14);
    __src = (pIVar6->ColorModifiers).Data;
    if (__src != (ImGuiColorMod *)0x0) {
      memcpy(__dest,__src,(long)(pIVar6->ColorModifiers).Size * 0x14);
      ImGui::MemFree((pIVar6->ColorModifiers).Data);
    }
    (pIVar6->ColorModifiers).Data = __dest;
    (pIVar6->ColorModifiers).Capacity = iVar10;
    iVar7 = (pIVar6->ColorModifiers).Size;
  }
  else {
    __dest = (GImPlot->ColorModifiers).Data;
  }
  __dest[iVar7].Col = idx;
  pIVar1 = &__dest[iVar7].BackupValue;
  pIVar1->x = fVar2;
  pIVar1->y = fVar3;
  pIVar1->z = fVar4;
  pIVar1->w = fVar5;
  (pIVar6->ColorModifiers).Size = (pIVar6->ColorModifiers).Size + 1;
  fVar2 = col->y;
  fVar3 = col->z;
  fVar4 = col->w;
  pIVar9->x = col->x;
  pIVar9->y = fVar2;
  pIVar1 = (pIVar6->Style).Colors + idx;
  pIVar1->z = fVar3;
  pIVar1->w = fVar4;
  return;
}

Assistant:

void PushStyleColor(ImPlotCol idx, const ImVec4& col) {
    ImPlotContext& gp = *GImPlot;
    ImGuiColorMod backup;
    backup.Col = idx;
    backup.BackupValue = gp.Style.Colors[idx];
    gp.ColorModifiers.push_back(backup);
    gp.Style.Colors[idx] = col;
}